

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalNinjaGenerator::WriteDyndepFile
          (cmGlobalNinjaGenerator *this,string *dir_top_src,string *dir_top_bld,string *dir_cur_src,
          string *dir_cur_bld,string *arg_dd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_ddis,string *module_dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *linked_target_dirs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forward_modules_from_target_dirs,string *arg_lang,string *arg_modmapfmt,
          cmCxxModuleExportInfo *export_info)

{
  _Rb_tree_color _Var1;
  cmake *pcVar2;
  string *psVar3;
  pointer pcVar4;
  pointer pcVar5;
  long *plVar6;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Elt_pointer pEVar10;
  _Elt_pointer pEVar11;
  pointer pbVar12;
  pointer pbVar13;
  undefined1 uVar14;
  bool bVar15;
  int iVar16;
  undefined4 uVar17;
  __uniq_ptr_data<cmMakefile,_std::default_delete<cmMakefile>,_true,_true> this_00;
  Value *pVVar18;
  Value *pVVar19;
  Value *pVVar20;
  iterator __position;
  _Link_type __z;
  uchar *puVar21;
  iterator __x;
  mapped_type *pmVar22;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_01;
  mapped_type *pmVar23;
  string *psVar24;
  iterator iVar25;
  _Rb_tree_node_base *p_Var26;
  _Base_ptr p_Var27;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  *p_Var28;
  cmScanDepInfo *pcVar29;
  _Link_type p_Var30;
  undefined8 uVar31;
  long lVar32;
  Value *source;
  Value *source_00;
  Value *source_01;
  ulong uVar33;
  char *pcVar34;
  undefined8 uVar35;
  _Head_base<0UL,_cmMakefile_*,_false> _Var36;
  _Alloc_hider _Var37;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_03;
  cmSourceReqInfo *r;
  _Elt_pointer pEVar39;
  pointer pcVar40;
  ValueHolder VVar41;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_10;
  string_view separator;
  const_iterator cVar42;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar43;
  static_string_view sVar44;
  Value target_module_info;
  string target_mods_file;
  Value ltm;
  CxxModuleReference module_reference;
  bool private_usage_found;
  vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> objects;
  Value target_modules;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
  mod_files;
  cmGeneratedFileStream tmf;
  CxxModuleUsage usages;
  cmGeneratedFileStream ddf;
  _Any_data __tmp_1;
  _Any_data __tmp_2;
  _Any_data local_8a8;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  local_898;
  code *pcStack_890;
  CxxModuleMapFormat local_87c;
  pointer local_878;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_870;
  ValueHolder local_868;
  pointer local_860;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  local_858;
  undefined8 local_850;
  char *local_848;
  long local_840;
  undefined1 local_838 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828;
  undefined1 local_818 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_808;
  _Any_data local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7e8;
  _Elt_pointer ppVStack_7e0;
  _Any_data local_7d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7c8;
  _Elt_pointer ppVStack_7c0;
  cmScanDepInfo *local_7b8;
  cmScanDepInfo *local_7b0;
  undefined1 local_7a8 [8];
  char *pcStack_7a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_798;
  _Alloc_hider local_788;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *local_780;
  undefined1 local_778 [16];
  _Any_data *local_768 [2];
  undefined1 local_758 [8];
  _Elt_pointer local_750;
  _Elt_pointer local_748;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_708 [2];
  undefined1 local_6d8 [48];
  _Alloc_hider local_6a8;
  size_type local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_678;
  _Any_data local_668;
  undefined8 local_658;
  ValueHolder local_650;
  _Elt_pointer local_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_640;
  string *local_628;
  string *local_620;
  undefined1 local_618 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5f8;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *local_5f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8;
  undefined1 local_5d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c8;
  _Base_ptr local_5b8;
  size_t local_5b0;
  string local_5a8;
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  ValueHolder local_568;
  string *local_560;
  _Elt_pointer local_558;
  ValueHolder local_550;
  _Elt_pointer local_548;
  _Map_pointer local_540;
  deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> local_538;
  _Alloc_hider local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8 [3];
  _Alloc_hider local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490 [23];
  CxxModuleUsage local_320;
  undefined1 local_2c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> vStack_288;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> local_270 [24];
  _Any_data *this_02;
  
  pcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  local_578._0_8_ = (pcVar2->CurrentSnapshot).Position.Position;
  local_588._0_8_ = (pcVar2->CurrentSnapshot).State;
  local_588._8_8_ = (pcVar2->CurrentSnapshot).Position.Tree;
  local_628 = arg_dd;
  local_620 = dir_top_bld;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_2c0,(cmStateSnapshot *)local_588);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_2c0,dir_cur_src);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_2c0,(cmStateSnapshot *)local_588);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_2c0,dir_cur_bld);
  this_00.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
  super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>)operator_new(0xdc0);
  cmMakefile::cmMakefile
            ((cmMakefile *)
             this_00.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,(cmGlobalGenerator *)this,
             (cmStateSnapshot *)local_588);
  local_2c0._0_8_ =
       this_00.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
       super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[2])
            (local_7a8,this,
             this_00.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  cmOutputConverter::SetRelativePathTop((cmOutputConverter *)local_7a8,dir_top_src,local_620);
  std::
  vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
  ::emplace_back<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>
            ((vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
              *)&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,
             (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)local_2c0);
  std::
  vector<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>,std::allocator<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>>>
  ::emplace_back<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>>
            ((vector<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>,std::allocator<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>>>
              *)&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,
             (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)local_7a8);
  local_870 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)this;
  if (local_7a8 != (undefined1  [8])0x0) {
    (**(code **)(*(size_type *)local_7a8 + 8))();
  }
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)local_2c0);
  local_668._M_unused._M_object = (cmScanDepInfo *)0x0;
  local_668._8_8_ = (cmScanDepInfo *)0x0;
  local_658 = 0;
  psVar24 = (arg_ddis->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (arg_ddis->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar24 != psVar3) {
    do {
      local_2c0._0_8_ = &local_2b0;
      local_2c0._8_8_ = (pointer)0x0;
      local_2b0._M_allocated_capacity = local_2b0._M_allocated_capacity & 0xffffffffffffff00;
      local_270[0].super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_270[0].super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_270[0].super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar15 = cmScanDepFormat_P1689_Parse(psVar24,(cmScanDepInfo *)local_2c0);
      if (bVar15) {
        std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::emplace_back<cmScanDepInfo>
                  ((vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&local_668,
                   (cmScanDepInfo *)local_2c0);
      }
      else {
        local_588._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x2f;
        local_588._8_8_ = "-E cmake_ninja_dyndep failed to parse ddi file ";
        local_578._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_568 = (ValueHolder)(psVar24->_M_dataplus)._M_p;
        local_578._8_8_ = psVar24->_M_string_length;
        local_560 = (string *)0x0;
        this = (cmGlobalNinjaGenerator *)local_7a8;
        views._M_len = 2;
        views._M_array = (iterator)local_588;
        cmCatViews((string *)this,views);
        cmSystemTools::Error((string *)this);
        if (local_7a8 != (undefined1  [8])&local_798) {
          operator_delete((void *)local_7a8,(ulong)(local_798._M_allocated_capacity + 1));
        }
      }
      std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector(local_270);
      std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector(&vStack_288);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._0_8_ != &local_2b0) {
        operator_delete((void *)local_2c0._0_8_,(ulong)(local_2b0._M_allocated_capacity + 1));
      }
      if (!bVar15) {
        bVar15 = false;
        goto LAB_00350899;
      }
      psVar24 = psVar24 + 1;
    } while (psVar24 != psVar3);
  }
  local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header;
  local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header;
  local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5c8._8_8_ = local_5d8 + 8;
  local_5d8._8_4_ = _S_red;
  local_5c8._M_allocated_capacity = 0;
  local_5b0 = 0;
  pcVar29 = (cmScanDepInfo *)
            (linked_target_dirs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_7b8 = (cmScanDepInfo *)
              (linked_target_dirs->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_5b8 = (_Base_ptr)local_5c8._8_8_;
  local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pcVar29 != local_7b8) {
    do {
      local_2c0._8_8_ = (pcVar29->PrimaryOutput)._M_dataplus._M_p;
      local_2c0._0_8_ = (pcVar29->PrimaryOutput)._M_string_length;
      local_2b0._M_allocated_capacity = 0;
      local_588._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_588._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_578._0_8_ = local_578 + 8;
      local_578[8] = 0x2f;
      local_2b0._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x1;
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(arg_lang->_M_dataplus)._M_p;
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)arg_lang->_M_string_length;
      vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0xc;
      local_270[0].super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x7f9766;
      local_270[0].super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      views_00._M_len = 4;
      views_00._M_array = (iterator)local_2c0;
      local_7b0 = pcVar29;
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_578._0_8_;
      cmCatViews((string *)&local_650,views_00);
      Json::Value::Value((Value *)local_818,nullValue);
      std::ifstream::ifstream(local_2c0,local_650.string_,_S_in|_S_bin);
      if ((*(byte *)((long)&local_2a0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (long)*(_Base_ptr *)(local_2c0._0_8_ + -0x18)) & 5) != 0) {
        pcVar34 = local_588;
        local_588._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x25;
        local_588._8_8_ = "-E cmake_ninja_dyndep failed to open ";
        local_578._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_578._8_8_ = local_648;
        local_568.int_ = local_650.int_;
        local_560 = (string *)0x0;
        local_558 = (_Elt_pointer)0x17;
        local_550 = (ValueHolder)0x7c80c1;
        local_548 = (_Elt_pointer)0x0;
        views_03._M_len = 3;
        views_03._M_array = (iterator)pcVar34;
        cmCatViews((string *)local_7a8,views_03);
        cmSystemTools::Error((string *)local_7a8);
        if (local_7a8 != (undefined1  [8])&local_798) {
          pcVar34 = (char *)(local_798._M_allocated_capacity + 1);
          operator_delete((void *)local_7a8,(ulong)pcVar34);
        }
        std::ifstream::~ifstream(local_2c0);
        Json::Value::~Value((Value *)local_818);
        if (local_650 != &local_640) goto LAB_0034f2e9;
        goto LAB_0034f2f1;
      }
      Json::Reader::Reader((Reader *)local_588);
      pcVar34 = local_2c0;
      p_Var30 = (_Link_type)0x0;
      bVar15 = Json::Reader::parse((Reader *)local_588,(istream *)pcVar34,(Value *)local_818,false);
      local_878 = (pointer)CONCAT71(local_878._1_7_,bVar15);
      if (bVar15) {
        bVar15 = Json::Value::isObject((Value *)local_818);
        if (bVar15) {
          pVVar18 = Json::Value::operator[]((Value *)local_818,"modules");
          bVar15 = Json::Value::isObject(pVVar18);
          if (bVar15) {
            cVar42 = Json::Value::begin(pVVar18);
            local_838._0_8_ = cVar42.super_ValueIteratorBase.current_._M_node;
            local_838[8] = cVar42.super_ValueIteratorBase.isNull_;
            while( true ) {
              cVar42 = Json::Value::end(pVVar18);
              local_7a8 = (undefined1  [8])cVar42.super_ValueIteratorBase.current_._M_node;
              pcStack_7a0 = (char *)CONCAT71(pcStack_7a0._1_7_,
                                             cVar42.super_ValueIteratorBase.isNull_);
              bVar15 = Json::ValueIteratorBase::isEqual
                                 ((ValueIteratorBase *)local_838,(SelfType *)local_7a8);
              if (bVar15) break;
              pVVar19 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_838);
              bVar15 = Json::Value::isObject(pVVar19);
              if (bVar15) {
                pVVar20 = Json::Value::operator[](pVVar19,"bmi");
                pVVar19 = Json::Value::operator[](pVVar19,"is-private");
                Json::Value::asString_abi_cxx11_((String *)local_7a8,pVVar20);
                bVar15 = Json::Value::asBool(pVVar19);
                local_788._M_p._0_1_ = bVar15;
                Json::ValueIteratorBase::key((Value *)&local_868,(ValueIteratorBase *)local_838);
                Json::Value::asString_abi_cxx11_((String *)&local_8a8,(Value *)&local_868);
                __position = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                             ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                               *)local_5c8._M_allocated_capacity,
                                              (_Link_type)(local_5d8 + 8),(_Base_ptr)&local_8a8,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)p_Var30);
                if (((_Link_type)__position._M_node == (_Link_type)(local_5d8 + 8)) ||
                   (iVar16 = std::__cxx11::string::compare((string *)local_8a8._M_pod_data),
                   __x = __position, iVar16 < 0)) {
                  __z = (_Link_type)operator_new(0x68);
                  puVar21 = (__z->_M_storage)._M_storage + 0x10;
                  *(uchar **)(__z->_M_storage)._M_storage = puVar21;
                  if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                       *)local_8a8._M_unused._0_8_ == &local_898) {
                    *(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                      **)puVar21 = local_898._M_head_impl;
                    *(code **)((__z->_M_storage)._M_storage + 0x18) = pcStack_890;
                  }
                  else {
                    *(void **)(__z->_M_storage)._M_storage = local_8a8._M_unused._M_object;
                    *(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                      **)puVar21 = local_898._M_head_impl;
                  }
                  *(undefined8 *)((__z->_M_storage)._M_storage + 8) = local_8a8._8_8_;
                  p_Var30 = (_Link_type)0x0;
                  local_8a8._8_8_ = 0;
                  local_898._M_head_impl =
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)((ulong)local_898._M_head_impl & 0xffffffffffffff00);
                  (__z->_M_storage)._M_storage[0x40] = '\0';
                  (__z->_M_storage)._M_storage[0x41] = '\0';
                  (__z->_M_storage)._M_storage[0x42] = '\0';
                  (__z->_M_storage)._M_storage[0x43] = '\0';
                  (__z->_M_storage)._M_storage[0x44] = '\0';
                  (__z->_M_storage)._M_storage[0x45] = '\0';
                  (__z->_M_storage)._M_storage[0x46] = '\0';
                  (__z->_M_storage)._M_storage[0x47] = '\0';
                  (__z->_M_storage)._M_storage[0x30] = '\0';
                  (__z->_M_storage)._M_storage[0x31] = '\0';
                  (__z->_M_storage)._M_storage[0x32] = '\0';
                  (__z->_M_storage)._M_storage[0x33] = '\0';
                  (__z->_M_storage)._M_storage[0x34] = '\0';
                  (__z->_M_storage)._M_storage[0x35] = '\0';
                  (__z->_M_storage)._M_storage[0x36] = '\0';
                  (__z->_M_storage)._M_storage[0x37] = '\0';
                  (__z->_M_storage)._M_storage[0x38] = '\0';
                  (__z->_M_storage)._M_storage[0x39] = '\0';
                  (__z->_M_storage)._M_storage[0x3a] = '\0';
                  (__z->_M_storage)._M_storage[0x3b] = '\0';
                  (__z->_M_storage)._M_storage[0x3c] = '\0';
                  (__z->_M_storage)._M_storage[0x3d] = '\0';
                  (__z->_M_storage)._M_storage[0x3e] = '\0';
                  (__z->_M_storage)._M_storage[0x3f] = '\0';
                  *(uchar **)((__z->_M_storage)._M_storage + 0x20) =
                       (__z->_M_storage)._M_storage + 0x30;
                  (__z->_M_storage)._M_storage[0x28] = '\0';
                  (__z->_M_storage)._M_storage[0x29] = '\0';
                  (__z->_M_storage)._M_storage[0x2a] = '\0';
                  (__z->_M_storage)._M_storage[0x2b] = '\0';
                  (__z->_M_storage)._M_storage[0x2c] = '\0';
                  (__z->_M_storage)._M_storage[0x2d] = '\0';
                  (__z->_M_storage)._M_storage[0x2e] = '\0';
                  (__z->_M_storage)._M_storage[0x2f] = '\0';
                  local_8a8._M_unused._M_object = &local_898;
                  pVar43 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                           ::_M_get_insert_hint_unique_pos
                                     ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                       *)local_5d8,(const_iterator)__position._M_node,
                                      (key_type *)&__z->_M_storage);
                  __x._M_node = pVar43.first;
                  if (pVar43.second == (_Base_ptr)0x0) {
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                    ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                    *)__z,(_Link_type)__position._M_node);
                  }
                  else {
                    p_Var30 = __z;
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                    ::_M_insert_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                      *)local_5d8,__x._M_node,pVar43.second,__z);
                    __x._M_node = (_Base_ptr)__z;
                  }
                }
                std::__cxx11::string::operator=
                          ((string *)((((_Link_type)__x._M_node)->_M_storage)._M_storage + 0x20),
                           (string *)((_Any_data *)local_7a8)->_M_pod_data);
                (((_Link_type)__x._M_node)->_M_storage)._M_storage[0x40] = (uchar)local_788._M_p;
                if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                     *)local_8a8._M_unused._0_8_ != &local_898) {
                  operator_delete(local_8a8._M_unused._M_object,
                                  (ulong)((long)&(local_898._M_head_impl)->_M_elems[0]._M_dataplus.
                                                 _M_p + 1));
                }
                Json::Value::~Value((Value *)&local_868);
                if (local_7a8 != (undefined1  [8])&local_798) {
                  operator_delete((void *)local_7a8,(ulong)(local_798._M_allocated_capacity + 1));
                }
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_838);
            }
          }
          this = (cmGlobalNinjaGenerator *)Json::Value::operator[]((Value *)local_818,"references");
          bVar15 = Json::Value::isObject((Value *)this);
          if (bVar15) {
            cVar42 = Json::Value::begin((Value *)this);
            local_838._0_8_ = cVar42.super_ValueIteratorBase.current_._M_node;
            local_838[8] = cVar42.super_ValueIteratorBase.isNull_;
            while( true ) {
              cVar42 = Json::Value::end((Value *)this);
              local_7a8 = (undefined1  [8])cVar42.super_ValueIteratorBase.current_._M_node;
              pcStack_7a0 = (char *)CONCAT71(pcStack_7a0._1_7_,
                                             cVar42.super_ValueIteratorBase.isNull_);
              bVar15 = Json::ValueIteratorBase::isEqual
                                 ((ValueIteratorBase *)local_838,(SelfType *)local_7a8);
              if (bVar15) break;
              pVVar18 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_838);
              bVar15 = Json::Value::isObject(pVVar18);
              if (bVar15) {
                pVVar18 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_838);
                pVVar18 = Json::Value::operator[](pVVar18,"path");
                local_7a8 = (undefined1  [8])&local_798;
                pcStack_7a0 = (char *)0x0;
                local_798._M_allocated_capacity =
                     local_798._M_allocated_capacity & 0xffffffffffffff00;
                bVar15 = Json::Value::isString(pVVar18);
                if (bVar15) {
                  Json::Value::asString_abi_cxx11_((String *)&local_868,pVVar18);
                  std::__cxx11::string::operator=
                            ((string *)((_Any_data *)local_7a8)->_M_pod_data,
                             (string *)&local_868.bool_);
                  if (local_868 != &local_858) {
                    operator_delete(local_868.string_,
                                    (ulong)((long)&(local_858._M_head_impl)->_M_elems[0]._M_dataplus
                                                   ._M_p + 1));
                  }
                }
                pVVar18 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_838);
                pVVar18 = Json::Value::operator[](pVVar18,"lookup-method");
                bVar15 = Json::Value::isString(pVVar18);
                if (bVar15) {
                  Json::Value::asString_abi_cxx11_((String *)&local_868,pVVar18);
                  iVar16 = std::__cxx11::string::compare((char *)&local_868.int_);
                  if (iVar16 == 0) {
                    uVar17 = 0;
LAB_0034ee1a:
                    local_788._M_p._0_4_ = uVar17;
                  }
                  else {
                    iVar16 = std::__cxx11::string::compare((char *)&local_868.int_);
                    if (iVar16 == 0) {
                      uVar17 = 1;
                      goto LAB_0034ee1a;
                    }
                    iVar16 = std::__cxx11::string::compare((char *)&local_868.int_);
                    if (iVar16 == 0) {
                      uVar17 = 2;
                      goto LAB_0034ee1a;
                    }
                  }
                  if (local_868 != &local_858) {
                    operator_delete(local_868.string_,
                                    (ulong)((long)&(local_858._M_head_impl)->_M_elems[0]._M_dataplus
                                                   ._M_p + 1));
                  }
                }
                Json::ValueIteratorBase::key((Value *)&local_868,(ValueIteratorBase *)local_838);
                Json::Value::asString_abi_cxx11_((String *)&local_8a8,(Value *)&local_868);
                pmVar22 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
                          ::operator[](&local_320.Reference,(key_type *)&local_8a8);
                std::__cxx11::string::_M_assign((string *)pmVar22);
                pmVar22->Method = (LookupMethod)local_788._M_p;
                if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                     *)local_8a8._M_unused._0_8_ != &local_898) {
                  operator_delete(local_8a8._M_unused._M_object,
                                  (ulong)((long)&(local_898._M_head_impl)->_M_elems[0]._M_dataplus.
                                                 _M_p + 1));
                }
                Json::Value::~Value((Value *)&local_868);
                if (local_7a8 != (undefined1  [8])&local_798) {
                  operator_delete((void *)local_7a8,(ulong)(local_798._M_allocated_capacity + 1));
                }
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_838);
            }
          }
          pcVar34 = "usages";
          pVVar18 = Json::Value::operator[]((Value *)local_818,"usages");
          bVar15 = Json::Value::isObject(pVVar18);
          if (bVar15) {
            cVar42 = Json::Value::begin(pVVar18);
            local_838._0_8_ = cVar42.super_ValueIteratorBase.current_._M_node;
            local_838[8] = cVar42.super_ValueIteratorBase.isNull_;
            while( true ) {
              cVar42 = Json::Value::end(pVVar18);
              local_7a8 = (undefined1  [8])cVar42.super_ValueIteratorBase.current_._M_node;
              pcStack_7a0 = (char *)CONCAT71(pcStack_7a0._1_7_,
                                             cVar42.super_ValueIteratorBase.isNull_);
              pcVar34 = (char *)local_7a8;
              bVar15 = Json::ValueIteratorBase::isEqual
                                 ((ValueIteratorBase *)local_838,(SelfType *)local_7a8);
              if (bVar15) break;
              pVVar19 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_838);
              bVar15 = Json::Value::isArray(pVVar19);
              if (bVar15) {
                pVVar19 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_838);
                cVar42 = Json::Value::begin(pVVar19);
                local_688._M_allocated_capacity =
                     (size_type)cVar42.super_ValueIteratorBase.current_._M_node;
                local_688._M_local_buf[8] = cVar42.super_ValueIteratorBase.isNull_;
                while( true ) {
                  pVVar19 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_838);
                  cVar42 = Json::Value::end(pVVar19);
                  local_7a8 = (undefined1  [8])cVar42.super_ValueIteratorBase.current_._M_node;
                  pcStack_7a0 = (char *)CONCAT71(pcStack_7a0._1_7_,
                                                 cVar42.super_ValueIteratorBase.isNull_);
                  bVar15 = Json::ValueIteratorBase::isEqual
                                     ((ValueIteratorBase *)&local_688,(SelfType *)local_7a8);
                  if (bVar15) break;
                  Json::ValueIteratorBase::key((Value *)local_7a8,(ValueIteratorBase *)local_838);
                  Json::Value::asString_abi_cxx11_((String *)&local_868,(Value *)local_7a8);
                  this_01 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               ::operator[](&local_320.Usage,(key_type *)&local_868);
                  pVVar19 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&local_688);
                  this = (cmGlobalNinjaGenerator *)&local_8a8;
                  Json::Value::asString_abi_cxx11_((String *)this,pVVar19);
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)this);
                  if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                       *)local_8a8._M_unused._0_8_ != &local_898) {
                    operator_delete(local_8a8._M_unused._M_object,
                                    (ulong)((long)&(local_898._M_head_impl)->_M_elems[0]._M_dataplus
                                                   ._M_p + 1));
                  }
                  if (local_868 != &local_858) {
                    operator_delete(local_868.string_,
                                    (ulong)((long)&(local_858._M_head_impl)->_M_elems[0]._M_dataplus
                                                   ._M_p + 1));
                  }
                  Json::Value::~Value((Value *)local_7a8);
                  Json::ValueIteratorBase::increment((ValueIteratorBase *)&local_688);
                }
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_838);
            }
          }
        }
      }
      else {
        Json::Reader::getFormattedErrorMessages_abi_cxx11_((String *)&local_8a8,(Reader *)local_588)
        ;
        local_7a8 = (undefined1  [8])0x26;
        pcStack_7a0 = "-E cmake_ninja_dyndep failed to parse ";
        local_798._M_allocated_capacity = 0;
        local_788._M_p = (local_7b0->PrimaryOutput)._M_dataplus._M_p;
        local_798._8_8_ = (local_7b0->PrimaryOutput)._M_string_length;
        local_780 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                     *)0x0;
        local_778._0_8_ = local_8a8._8_8_;
        local_778._8_8_ = local_8a8._M_unused._M_object;
        views_01._M_len = 3;
        views_01._M_array = (iterator)local_7a8;
        pcVar34 = (char *)local_7a8;
        local_768[0] = &local_8a8;
        cmCatViews((string *)&local_868,views_01);
        cmSystemTools::Error((string *)&local_868);
        if (local_868 != &local_858) {
          pcVar34 = (char *)((long)&(local_858._M_head_impl)->_M_elems[0]._M_dataplus._M_p + 1);
          operator_delete(local_868.string_,(ulong)pcVar34);
        }
        if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
             *)local_8a8._M_unused._0_8_ != &local_898) {
          pcVar34 = (char *)((long)&(local_898._M_head_impl)->_M_elems[0]._M_dataplus._M_p + 1);
          operator_delete(local_8a8._M_unused._M_object,(ulong)pcVar34);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_p != local_490) {
        pcVar34 = (char *)(local_490[0]._M_allocated_capacity + 1);
        operator_delete(local_4a0._M_p,(ulong)pcVar34);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_p != local_4d8) {
        pcVar34 = (char *)(local_4d8[0]._M_allocated_capacity + 1);
        operator_delete(local_4e8._M_p,(ulong)pcVar34);
      }
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                (&local_538);
      std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_588);
      std::ifstream::~ifstream(local_2c0);
      Json::Value::~Value((Value *)local_818);
      if (local_650 != &local_640) {
        pcVar34 = (char *)(local_640._M_allocated_capacity + 1);
        operator_delete(local_650.string_,(ulong)pcVar34);
      }
      if ((char)local_878 == '\0') goto LAB_0034f2f1;
      pcVar29 = (cmScanDepInfo *)&local_7b0->ExtraOutputs;
    } while (pcVar29 != local_7b8);
  }
  local_87c = Clang;
  if (arg_modmapfmt->_M_string_length == 0) {
    uVar33 = 0;
  }
  else {
    iVar16 = std::__cxx11::string::compare((char *)arg_modmapfmt);
    uVar33 = CONCAT71((int7)((ulong)this >> 8),1);
    if (iVar16 != 0) {
      iVar16 = std::__cxx11::string::compare((char *)arg_modmapfmt);
      if (iVar16 == 0) {
        local_87c = Gcc;
      }
      else {
        iVar16 = std::__cxx11::string::compare((char *)arg_modmapfmt);
        if (iVar16 != 0) {
          pcVar34 = local_2c0;
          local_2c0._0_8_ = (__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>)0x2e;
          local_2c0._8_8_ = "-E cmake_ninja_dyndep does not understand the ";
          local_2b0._M_allocated_capacity = 0;
          local_2a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(arg_modmapfmt->_M_dataplus)._M_p;
          local_2b0._8_8_ = arg_modmapfmt->_M_string_length;
          local_2a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x12;
          vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x7f9838;
          vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          views_02._M_len = 3;
          views_02._M_array = (iterator)pcVar34;
          cmCatViews((string *)local_588,views_02);
          cmSystemTools::Error((string *)local_588);
          local_640._M_allocated_capacity = local_578._0_8_;
          local_650 = (ValueHolder)local_588._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578) {
LAB_0034f2e9:
            pcVar34 = (char *)(local_640._M_allocated_capacity + 1);
            operator_delete(local_650.string_,(ulong)pcVar34);
          }
LAB_0034f2f1:
          bVar15 = false;
          goto LAB_00350872;
        }
        local_87c = Msvc;
      }
    }
  }
  sVar44 = CxxModuleMapExtension
                     ((optional<CxxModuleMapFormat>)((ulong)local_87c | (uVar33 & 0xff) << 0x20));
  local_878 = (pointer)sVar44.super_string_view._M_str;
  local_7b8 = (cmScanDepInfo *)CONCAT44(local_7b8._4_4_,(int)uVar33);
  Json::Value::Value((Value *)&local_650,objectValue);
  local_7b0 = (cmScanDepInfo *)local_668._8_8_;
  if (local_668._M_unused._M_object != (void *)local_668._8_8_) {
    uVar31 = local_668._M_unused._0_8_;
    do {
      pcVar4 = (((cmScanDepInfo *)uVar31)->Provides).
               super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar40 = (((cmScanDepInfo *)uVar31)->Provides).
                     super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                     super__Vector_impl_data._M_start; pcVar40 != pcVar4; pcVar40 = pcVar40 + 1) {
        local_588._0_8_ = local_578;
        local_588._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_578._0_8_ = local_578._0_8_ & 0xffffffffffffff00;
        bVar15 = cmDyndepCollation::IsBmiOnly(export_info,(string *)uVar31);
        if (bVar15) {
          std::__cxx11::string::_M_assign((string *)local_588);
        }
        else if ((pcVar40->CompiledModulePath)._M_string_length == 0) {
          local_7a8 = (undefined1  [8])&local_798;
          pcVar5 = (pcVar40->LogicalName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_7a8,pcVar5,pcVar5 + (pcVar40->LogicalName)._M_string_length);
          cmsys::SystemTools::ReplaceString((string *)local_7a8,":","-");
          local_2c0._8_8_ = (module_dir->_M_dataplus)._M_p;
          local_2c0._0_8_ = module_dir->_M_string_length;
          local_2b0._M_allocated_capacity = 0;
          local_2b0._8_8_ = pcStack_7a0;
          local_2a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_7a8;
          local_2a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_start = local_878;
          vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          views_04._M_len = 3;
          views_04._M_array = (iterator)local_2c0;
          local_2a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)sVar44.super_string_view._M_len;
          cmCatViews((string *)local_818,views_04);
          std::__cxx11::string::operator=((string *)local_588,(string *)local_818);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_818._0_8_ != &local_808) {
            operator_delete((void *)local_818._0_8_,(ulong)(local_808._M_allocated_capacity + 1));
          }
          uVar35 = local_798._M_allocated_capacity;
          _Var36._M_head_impl = (cmMakefile *)local_7a8;
          if (local_7a8 != (undefined1  [8])&local_798) {
LAB_0034f54a:
            operator_delete(_Var36._M_head_impl,(ulong)(uVar35 + 1));
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)local_588);
          bVar15 = cmsys::SystemTools::FileIsFullPath((string *)local_588);
          if (!bVar15) {
            cmsys::SystemTools::CollapseFullPath((string *)local_2c0,(string *)local_588,local_620);
            std::__cxx11::string::operator=((string *)local_588,(string *)local_2c0);
            uVar35 = local_2b0._M_allocated_capacity;
            _Var36._M_head_impl = (cmMakefile *)local_2c0._0_8_;
            if ((cmMakefile *)local_2c0._0_8_ != (cmMakefile *)&local_2b0) goto LAB_0034f54a;
          }
        }
        local_2c0._0_8_ = &local_2b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c0,local_588._0_8_,(pointer)(local_588._8_8_ + local_588._0_8_))
        ;
        local_2a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)local_2a0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        pmVar23 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                *)local_5d8,&pcVar40->LogicalName);
        std::__cxx11::string::operator=((string *)pmVar23,(string *)local_2c0);
        pmVar23->IsPrivate =
             local_2a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._0_8_ != &local_2b0) {
          operator_delete((void *)local_2c0._0_8_,(ulong)(local_2b0._M_allocated_capacity + 1));
        }
        Json::Value::Value((Value *)local_2c0,objectValue);
        pVVar18 = Json::Value::operator[]((Value *)&local_650,&pcVar40->LogicalName);
        pVVar18 = Json::Value::operator=(pVVar18,(Value *)local_2c0);
        Json::Value::~Value((Value *)local_2c0);
        Json::Value::Value((Value *)local_2c0,(string *)local_588);
        pVVar19 = Json::Value::operator[](pVVar18,"bmi");
        Json::Value::operator=(pVVar19,(Value *)local_2c0);
        Json::Value::~Value((Value *)local_2c0);
        bVar15 = cmDyndepCollation::IsObjectPrivate((string *)uVar31,export_info);
        Json::Value::Value((Value *)local_2c0,bVar15);
        pVVar18 = Json::Value::operator[](pVVar18,"is-private");
        Json::Value::operator=(pVVar18,(Value *)local_2c0);
        Json::Value::~Value((Value *)local_2c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578) {
          operator_delete((void *)local_588._0_8_,(ulong)(local_578._0_8_ + 1));
        }
      }
      uVar31 = uVar31 + 0x68;
    } while ((cmScanDepInfo *)uVar31 != local_7b0);
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2c0,local_628,false,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c0,"ninja_dyndep_version = 1.0\n",0x1b);
  this_03 = local_870;
  local_818._0_8_ = &local_808;
  local_818._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_808._M_allocated_capacity = local_808._M_allocated_capacity & 0xffffffffffffff00;
  local_7f8._M_unused._M_object = (cmState *)0x0;
  local_7f8._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  local_7e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  ppVStack_7e0 = (_Elt_pointer)0x0;
  local_7d8._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_7d8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_7c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  ppVStack_7c0 = (_Elt_pointer)0x0;
  paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x1;
  std::__cxx11::string::_M_replace((ulong)local_818,0,(char *)0x0,0x81f2f4);
  pcVar29 = local_7b8;
  pbVar8 = local_7e8;
  local_7a8 = (undefined1  [8])this_03;
  pcStack_7a0 = (char *)0x0;
  local_588._0_8_ = local_7f8._M_unused._M_object;
  local_588._8_8_ = local_7f8._8_8_;
  local_7f8._M_unused._M_object = this_03;
  local_7f8._8_8_ = 0;
  local_578._0_8_ = local_7e8;
  local_7e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2737:29)>
              ::_M_manager;
  local_578._8_8_ = ppVStack_7e0;
  ppVStack_7e0 = (_Elt_pointer)
                 std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2737:29)>
                 ::_M_invoke;
  if (pbVar8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (*(code *)pbVar8)(local_588,local_588,3);
  }
  paVar9 = local_7c8;
  local_588._0_8_ = local_7d8._M_unused._M_object;
  local_588._8_8_ = local_7d8._8_8_;
  local_7d8._8_8_ = 0;
  local_578._0_8_ = local_7c8;
  local_7c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::
                 _Function_handler<CxxBmiLocation_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2747:7)>
                 ::_M_manager;
  local_578._8_8_ = ppVStack_7c0;
  ppVStack_7c0 = (_Elt_pointer)
                 std::
                 _Function_handler<CxxBmiLocation_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2747:7)>
                 ::_M_invoke;
  local_7d8._M_unused._M_object = (String *)local_5d8;
  if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    (*(code *)paVar9)(local_588,local_588,3);
  }
  if ((char)pcVar29 == '\0') {
LAB_0034f9fd:
    local_5f8 = &local_5e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"dyndep","");
    local_7a8 = (undefined1  [8])&local_798;
    pcStack_7a0 = (char *)0x0;
    local_798._M_allocated_capacity = local_798._M_allocated_capacity & 0xffffffffffffff00;
    local_788._M_p = local_778;
    if (local_5f8 == &local_5e8) {
      local_778._8_8_ = local_5e8._8_8_;
    }
    else {
      local_788._M_p = (pointer)local_5f8;
    }
    local_778._1_7_ = local_5e8._1_7_;
    local_778[0] = local_5e8._M_local_buf[0];
    local_780 = local_5f0;
    local_5f0 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                 *)0x0;
    local_5e8._M_local_buf[0] = '\0';
    local_6d8._8_4_ = _S_red;
    local_6d8._16_8_ = (_Base_ptr)0x0;
    local_5f8 = &local_5e8;
    memset((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_768,0,0x90);
    local_6d8._40_8_ = 0;
    local_6a8._M_p = (pointer)&local_698;
    local_6a0 = 0;
    local_698._M_local_buf[0] = '\0';
    local_6d8._24_8_ = (_Base_ptr)(local_6d8 + 8);
    local_6d8._32_8_ = (_Base_ptr)(local_6d8 + 8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[1]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_768,
               (char (*) [1])0x84ab39);
    local_878 = (pointer)local_668._8_8_;
    if (local_668._M_unused._M_object != (void *)local_668._8_8_) {
      uVar31 = local_668._M_unused._0_8_;
      do {
        ConvertToNinjaPath((cmGlobalNinjaGenerator *)this_03,(string *)uVar31);
        std::__cxx11::string::_M_assign((string *)local_768[0]->_M_pod_data);
        pEVar11 = local_748;
        pEVar10 = local_750;
        if (local_748 != local_750) {
          paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_750->token_).end_;
          do {
            if (paVar38 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar38->_M_allocated_capacity)[-2]) {
              operator_delete((long *)(&paVar38->_M_allocated_capacity)[-2],
                              paVar38->_M_allocated_capacity + 1);
            }
            pEVar39 = (_Elt_pointer)(&paVar38->_M_allocated_capacity + 2);
            paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar38->_M_allocated_capacity + 4);
          } while (pEVar39 != pEVar11);
          local_748 = pEVar10;
        }
        pcVar4 = (((cmScanDepInfo *)uVar31)->Provides).
                 super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pcVar40 = (((cmScanDepInfo *)uVar31)->Provides).
                       super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl
                       .super__Vector_impl_data._M_start;
            pbVar13 = local_708[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            pbVar12 = local_708[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, pcVar40 != pcVar4;
            pcVar40 = pcVar40 + 1) {
          pmVar23 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                  *)local_5d8,&pcVar40->LogicalName);
          psVar24 = ConvertToNinjaPath((cmGlobalNinjaGenerator *)local_870,&pmVar23->BmiPath);
          pcVar5 = (psVar24->_M_dataplus)._M_p;
          local_588._0_8_ = local_578;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_588,pcVar5,pcVar5 + psVar24->_M_string_length);
          VVar41 = (ValueHolder)local_588._0_8_;
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_588._8_8_ !=
               *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)(local_768[0]->_M_pod_data + 8)) ||
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_588._8_8_ !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0 &&
              (iVar16 = bcmp((void *)local_588._0_8_,*(void **)local_768[0],local_588._8_8_),
              iVar16 != 0)))) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_750,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_588);
            VVar41 = (ValueHolder)local_588._0_8_;
          }
          if (VVar41 != local_578) {
            operator_delete(VVar41.string_,(ulong)(local_578._0_8_ + 1));
          }
        }
        if (local_708[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_708[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar38 = &(local_708[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar6 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar38 + -1))->_M_dataplus)._M_p;
            if (paVar38 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar6) {
              operator_delete(plVar6,paVar38->_M_allocated_capacity + 1);
            }
            plVar6 = (long *)(paVar38 + 1);
            paVar38 = paVar38 + 2;
          } while ((pointer)plVar6 != pbVar13);
          local_708[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar12;
        }
        this_03 = local_870;
        pcVar4 = (((cmScanDepInfo *)uVar31)->Requires).
                 super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pcVar40 = (((cmScanDepInfo *)uVar31)->Requires).
                       super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl
                       .super__Vector_impl_data._M_start; pcVar40 != pcVar4; pcVar40 = pcVar40 + 1)
        {
          iVar25 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                           *)local_5d8,&pcVar40->LogicalName);
          if (iVar25._M_node != (_Base_ptr)(local_5d8 + 8)) {
            psVar24 = ConvertToNinjaPath((cmGlobalNinjaGenerator *)this_03,
                                         (string *)(iVar25._M_node + 2));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_708,psVar24);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_6d8);
        if ((((cmScanDepInfo *)uVar31)->Provides).
            super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (((cmScanDepInfo *)uVar31)->Provides).
            super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[7],char_const(&)[2]>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_6d8,(char (*) [7])"restat",(char (*) [2])0x85ce88);
        }
        if ((uchar)local_7b8 != '\0') {
          CxxModuleMapContent_abi_cxx11_
                    ((string *)&local_8a8,local_87c,(CxxModuleLocations *)local_818,
                     (cmScanDepInfo *)uVar31,&local_320);
          local_860 = (((cmScanDepInfo *)uVar31)->PrimaryOutput)._M_dataplus._M_p;
          local_868 = (ValueHolder)(((cmScanDepInfo *)uVar31)->PrimaryOutput)._M_string_length;
          local_858._M_head_impl =
               (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                *)0x0;
          local_850 = 7;
          local_848 = ".modmap";
          local_840 = 0;
          views_06._M_len = 2;
          views_06._M_array = (iterator)&local_868;
          cmCatViews((string *)local_838,views_06);
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)local_588,(string *)local_838,false,None);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_838._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_838 + 0x10)) {
            operator_delete((void *)local_838._0_8_,local_828._M_allocated_capacity + 1);
          }
          cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_588,true);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_588,(char *)local_8a8._M_unused._0_8_,local_8a8._8_8_);
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_588);
          if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
               *)local_8a8._M_unused._0_8_ != &local_898) {
            operator_delete(local_8a8._M_unused._M_object,
                            (ulong)((long)&(local_898._M_head_impl)->_M_elems[0]._M_dataplus._M_p +
                                   1));
          }
        }
        paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        WriteBuild((cmGlobalNinjaGenerator *)this_03,(ostream *)local_2c0,(cmNinjaBuild *)local_7a8,
                   0,(bool *)0x0);
        uVar31 = uVar31 + 0x68;
      } while ((pointer)uVar31 != local_878);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_7a8);
    if (local_7c8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (*(code *)local_7c8)(&local_7d8,&local_7d8,__destroy_functor);
    }
    if (local_7e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)local_7e8)(&local_7f8,&local_7f8,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_818._0_8_ != &local_808) {
      operator_delete((void *)local_818._0_8_,(ulong)(local_808._M_allocated_capacity + 1));
    }
    Json::Value::Value((Value *)&local_868,objectValue);
    pVVar18 = Json::Value::operator[]((Value *)&local_868,"modules");
    Json::Value::operator=(pVVar18,(Value *)&local_650);
    Json::Value::Value((Value *)local_588,objectValue);
    pVVar18 = Json::Value::operator[]((Value *)&local_868,"usages");
    pVVar18 = Json::Value::operator=(pVVar18,(Value *)local_588);
    Json::Value::~Value((Value *)local_588);
    if ((_Rb_tree_header *)local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_320.Usage._M_t._M_impl.super__Rb_tree_header) {
      p_Var27 = local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        Json::Value::Value((Value *)local_588,arrayValue);
        pVVar19 = Json::Value::operator[](pVVar18,(String *)(p_Var27 + 1));
        pVVar19 = Json::Value::operator=(pVVar19,(Value *)local_588);
        Json::Value::~Value((Value *)local_588);
        for (p_Var26 = p_Var27[2]._M_right; p_Var26 != (_Rb_tree_node_base *)&p_Var27[2]._M_parent;
            p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26)) {
          Json::Value::Value((Value *)local_588,(String *)(p_Var26 + 1));
          Json::Value::append(pVVar19,(Value *)local_588);
          Json::Value::~Value((Value *)local_588);
        }
        p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27);
      } while ((_Rb_tree_header *)p_Var27 != &local_320.Usage._M_t._M_impl.super__Rb_tree_header);
    }
    Json::Value::Value((Value *)local_588,objectValue);
    pVVar19 = Json::Value::operator[]((Value *)&local_868,"references");
    local_870 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)Json::Value::operator=(pVVar19,(Value *)local_588);
    Json::Value::~Value((Value *)local_588);
    if ((_Rb_tree_header *)local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        != &local_320.Reference._M_t._M_impl.super__Rb_tree_header) {
      p_Var27 = local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        Json::Value::Value((Value *)local_588,objectValue);
        pVVar19 = Json::Value::operator[]((Value *)local_870,(String *)(p_Var27 + 1));
        pVVar19 = Json::Value::operator=(pVVar19,(Value *)local_588);
        Json::Value::~Value((Value *)local_588);
        Json::Value::Value((Value *)local_588,(String *)(p_Var27 + 2));
        pVVar20 = Json::Value::operator[](pVVar19,"path");
        Json::Value::operator=(pVVar20,(Value *)local_588);
        Json::Value::~Value((Value *)local_588);
        _Var1 = p_Var27[3]._M_color;
        if (_Var1 == _S_red) {
          lVar32 = 7;
          pcVar34 = "by-name";
        }
        else if (_Var1 == 2) {
          lVar32 = 0xd;
          pcVar34 = "include-quote";
        }
        else {
          if (_Var1 != _S_black) {
            __assert_fail("false && \"unsupported lookup method\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx"
                          ,0xb16,
                          "auto cmGlobalNinjaGenerator::WriteDyndepFile(const std::string &, const std::string &, const std::string &, const std::string &, const std::string &, const std::vector<std::string> &, const std::string &, const std::vector<std::string> &, const std::vector<std::string> &, const std::string &, const std::string &, const cmCxxModuleExportInfo &)::(anonymous class)::operator()(LookupMethod) const"
                         );
          }
          lVar32 = 0xd;
          pcVar34 = "include-angle";
        }
        local_7a8 = (undefined1  [8])&local_798;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,pcVar34,pcVar34 + lVar32);
        Json::Value::Value((Value *)local_588,(String *)local_7a8);
        pVVar19 = Json::Value::operator[](pVVar19,"lookup-method");
        Json::Value::operator=(pVVar19,(Value *)local_588);
        Json::Value::~Value((Value *)local_588);
        if (local_7a8 != (undefined1  [8])&local_798) {
          operator_delete((void *)local_7a8,local_798._M_allocated_capacity + 1);
        }
        p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27);
      } while ((_Rb_tree_header *)p_Var27 != &local_320.Reference._M_t._M_impl.super__Rb_tree_header
              );
    }
    cmsys::SystemTools::GetFilenamePath((string *)local_818,local_628);
    local_588._0_8_ = local_818._8_8_;
    local_588._8_8_ = local_818._0_8_;
    local_798._M_allocated_capacity = (size_type)(local_798._M_local_buf + 8);
    local_7a8 = (undefined1  [8])0x0;
    pcStack_7a0 = (char *)0x1;
    local_798._M_local_buf[8] = 0x2f;
    local_578._8_8_ = (_Elt_pointer)0x1;
    local_560 = (string *)0x0;
    local_550 = (ValueHolder)(arg_lang->_M_dataplus)._M_p;
    local_558 = (_Elt_pointer)arg_lang->_M_string_length;
    local_548 = (_Elt_pointer)0x0;
    local_540 = (_Map_pointer)0xc;
    local_538.super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
    _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x7f9766;
    local_538.super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
    _M_impl.super__Deque_impl_data._M_map_size = 0;
    views_07._M_len = 4;
    views_07._M_array = (iterator)local_588;
    local_578._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_818;
    local_568.string_ = (char *)local_798._M_allocated_capacity;
    cmCatViews((string *)local_838,views_07);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_818._0_8_ != &local_808) {
      operator_delete((void *)local_818._0_8_,(ulong)(local_808._M_allocated_capacity + 1));
    }
    pcVar40 = (pointer)(forward_modules_from_target_dirs->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
    local_878 = (pointer)(forward_modules_from_target_dirs->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar40 != local_878) {
      do {
        this_02 = (_Any_data *)local_7a8;
        local_588._8_8_ = (pcVar40->LogicalName)._M_dataplus._M_p;
        local_588._0_8_ = (pcVar40->LogicalName)._M_string_length;
        local_578._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_7a8 = (undefined1  [8])0x0;
        pcStack_7a0 = (char *)0x1;
        local_798._M_allocated_capacity = (size_type)(local_798._M_local_buf + 8);
        local_798._M_local_buf[8] = 0x2f;
        local_578._8_8_ = (_Elt_pointer)0x1;
        local_560 = (string *)0x0;
        local_550 = (ValueHolder)(arg_lang->_M_dataplus)._M_p;
        local_558 = (_Elt_pointer)arg_lang->_M_string_length;
        local_548 = (_Elt_pointer)0x0;
        local_540 = (_Map_pointer)0xc;
        local_538.
        super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl
        .super__Deque_impl_data._M_map = (_Map_pointer)0x7f9766;
        local_538.
        super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl
        .super__Deque_impl_data._M_map_size = 0;
        views_08._M_len = 4;
        views_08._M_array = (iterator)local_588;
        local_568.string_ = (char *)local_798._M_allocated_capacity;
        cmCatViews((string *)&local_688,views_08);
        Json::Value::Value((Value *)&local_8a8,nullValue);
        std::ifstream::ifstream
                  ((_Any_data *)local_588,(char *)local_688._M_allocated_capacity,_S_in|_S_bin);
        if ((*(byte *)((long)&local_568 + *(size_type *)(local_588._0_8_ + -0x18)) & 5) == 0) {
          Json::Reader::Reader((Reader *)this_02);
          pcVar34 = (char *)local_588;
          bVar15 = Json::Reader::parse((Reader *)this_02,(istream *)local_588,(Value *)&local_8a8,
                                       false);
          if (bVar15) {
            bVar15 = Json::Value::isObject((Value *)&local_8a8);
            iVar16 = 0x23;
            if (bVar15) {
              pVVar19 = Json::Value::operator[]((Value *)&local_868,"modules");
              pVVar20 = Json::Value::operator[]((Value *)&local_8a8,"modules");
              WriteDyndepFile::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)pVVar19,pVVar20,source);
              pVVar19 = Json::Value::operator[]((Value *)&local_8a8,"references");
              WriteDyndepFile::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)local_870->_M_local_buf,pVVar19,source_00);
              pcVar34 = (char *)Json::Value::operator[]((Value *)&local_8a8,"usages");
              iVar16 = 0;
              WriteDyndepFile::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)pVVar18,(Value *)pcVar34,source_01);
            }
          }
          else {
            Json::Reader::getFormattedErrorMessages_abi_cxx11_
                      ((String *)local_618,(Reader *)this_02);
            local_818._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x26;
            local_818._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
            local_808._M_allocated_capacity = 0;
            local_7f8._M_unused._M_object = (pcVar40->LogicalName)._M_dataplus._M_p;
            local_808._8_8_ = (pcVar40->LogicalName)._M_string_length;
            local_7f8._8_8_ = 0;
            local_7e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_618._8_8_;
            ppVStack_7e0 = (_Elt_pointer)local_618._0_8_;
            pcVar34 = local_818;
            views_10._M_len = 3;
            views_10._M_array = (iterator)pcVar34;
            local_7d8._M_unused._M_object = (String *)local_618;
            cmCatViews(&local_5a8,views_10);
            cmSystemTools::Error(&local_5a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
              pcVar34 = (char *)(local_5a8.field_2._0_8_ + 1);
              operator_delete(local_5a8._M_dataplus._M_p,(ulong)pcVar34);
            }
            if ((undefined1 *)local_618._0_8_ != local_618 + 0x10) {
              pcVar34 = (char *)(local_608._M_allocated_capacity + 1);
              operator_delete((void *)local_618._0_8_,(ulong)pcVar34);
            }
            iVar16 = 1;
          }
          if ((_Base_ptr)local_6d8._24_8_ != (_Base_ptr)(local_6d8 + 0x28)) {
            pcVar34 = (char *)(local_6d8._40_8_ + 1);
            operator_delete((void *)local_6d8._24_8_,(ulong)pcVar34);
          }
          if (local_708[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&local_708[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pcVar34 = (char *)((long)&((local_708[0].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                      _M_dataplus)._M_p + 1);
            operator_delete(local_708[0].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,(ulong)pcVar34);
          }
          std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                    ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                     local_758);
          std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                    ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_7a8);
        }
        else {
          local_7a8 = (undefined1  [8])0x25;
          pcStack_7a0 = "-E cmake_ninja_dyndep failed to open ";
          local_798._M_allocated_capacity = 0;
          local_798._8_8_ = CONCAT71(local_688._9_7_,local_688._M_local_buf[8]);
          local_788._M_p = (pointer)local_688._M_allocated_capacity;
          local_780 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                       *)0x0;
          local_778._0_8_ = 0x17;
          local_778._8_8_ = " for module information";
          local_768[0] = (_Any_data *)0x0;
          views_09._M_len = 3;
          views_09._M_array = (iterator)this_02;
          cmCatViews((string *)local_818,views_09);
          cmSystemTools::Error((string *)local_818);
          pcVar34 = (char *)this_02;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_818._0_8_ != &local_808) {
            pcVar34 = (char *)(local_808._M_allocated_capacity + 1);
            operator_delete((void *)local_818._0_8_,(ulong)pcVar34);
          }
          iVar16 = 1;
        }
        std::ifstream::~ifstream((_Any_data *)local_588);
        Json::Value::~Value((Value *)&local_8a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688._M_allocated_capacity != &local_678) {
          pcVar34 = (char *)(local_678._M_allocated_capacity + 1);
          operator_delete((void *)local_688._M_allocated_capacity,(ulong)pcVar34);
        }
        if ((iVar16 != 0x23) && (iVar16 != 0)) {
          bVar15 = false;
          goto LAB_0035082d;
        }
        pcVar40 = (pointer)&pcVar40->SourcePath;
      } while (pcVar40 != local_878);
    }
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_588,(string *)local_838,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_588,true);
    Json::operator<<((OStream *)local_588,(Value *)&local_868);
    local_898._M_head_impl =
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)0x0;
    pcStack_890 = (code *)0x0;
    local_8a8._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_8a8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
           *)local_7a8,
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
           *)local_5d8);
    local_818._8_8_ = 0;
    p_Var28 = (_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
               *)operator_new(0x30);
    _Var7._M_head_impl = local_898._M_head_impl;
    uVar31 = p_Var28 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_allocated_capacity ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      p_Var28[2]._M_head_impl =
           (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
            *)0x0;
      p_Var30 = (_Link_type)(p_Var28 + 5);
      uVar17 = 0;
      _Var37._M_p = (pointer)uVar31;
    }
    else {
      paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&pcStack_7a0;
      p_Var28[2]._M_head_impl =
           (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
            *)local_798._M_allocated_capacity;
      *(undefined8 *)&((_Rb_tree_header *)(local_798._M_allocated_capacity + 8))->_M_header = uVar31
      ;
      p_Var30 = (_Link_type)&local_780;
      p_Var28[5]._M_head_impl = local_780;
      local_798._M_allocated_capacity = 0;
      uVar31 = local_798._8_8_;
      _Var37._M_p = local_788._M_p;
      uVar17 = pcStack_7a0._0_4_;
      local_798._8_8_ = paVar38;
      local_788._M_p = (pointer)paVar38;
    }
    p_Var28[3]._M_head_impl =
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)uVar31;
    p_Var28[4]._M_head_impl =
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)_Var37._M_p;
    *(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> **
     )&p_Var30->super__Rb_tree_node_base =
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)0x0;
    *(undefined4 *)&p_Var28[1]._M_head_impl = uVar17;
    local_818._0_8_ = local_8a8._M_unused._M_object;
    VVar41.int_ = local_8a8._8_8_;
    local_8a8._8_8_ = local_818._8_8_;
    local_808._M_allocated_capacity = (size_type)local_898._M_head_impl;
    local_898._M_head_impl =
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)std::
            _Function_handler<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2905:5)>
            ::_M_manager;
    local_808._8_8_ = pcStack_890;
    pcStack_890 = std::
                  _Function_handler<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2905:5)>
                  ::_M_invoke;
    local_8a8._M_unused._0_8_ = (undefined8)p_Var28;
    local_818._8_8_ = VVar41.int_;
    if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
         )_Var7._M_head_impl ==
        (_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
         )0x0) {
      uVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
    }
    else {
      p_Var30 = (_Link_type)local_818;
      (*(code *)_Var7._M_head_impl)(p_Var30,p_Var30,3);
      uVar31 = local_798._M_allocated_capacity;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                *)uVar31,p_Var30);
    pcVar34 = (char *)&local_668;
    bVar15 = cmDyndepCollation::WriteDyndepMetadata
                       ((cmDyndepCollation *)arg_lang,(string *)pcVar34,
                        (vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)export_info,
                        (cmCxxModuleExportInfo *)&local_8a8,(cmDyndepMetadataCallbacks *)paVar38);
    if (local_898._M_head_impl !=
        (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
         *)0x0) {
      pcVar34 = (char *)&local_8a8;
      (*(code *)local_898._M_head_impl)(pcVar34,pcVar34,3);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_588);
LAB_0035082d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_838._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_838 + 0x10)) {
      pcVar34 = (char *)(local_828._M_allocated_capacity + 1);
      operator_delete((void *)local_838._0_8_,(ulong)pcVar34);
    }
    Json::Value::~Value((Value *)&local_868);
  }
  else {
    paVar38 = &local_688;
    local_688._M_allocated_capacity = local_688._M_allocated_capacity & 0xffffffffffffff00;
    pcVar34 = local_818;
    CxxModuleUsageSeed_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_868,(CxxModuleLocations *)pcVar34,
               (vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&local_668,&local_320,
               (bool *)paVar38->_M_local_buf);
    if (local_840 == 0) {
      uVar14 = local_688._M_local_buf[0];
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_868);
      if (uVar14 == '\0') goto LAB_0034f9fd;
    }
    else {
      separator._M_str = "\", \"";
      separator._M_len = 4;
      cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((string *)local_838,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_868,separator);
      pcVar34 = local_588;
      local_588._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x51;
      local_588._8_8_ =
           "Circular dependency detected in the C++ module import graph. See modules named: \"";
      local_578._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_578._8_8_ = CONCAT71(local_838._9_7_,local_838[8]);
      local_568.string_ = (char *)local_838._0_8_;
      local_798._M_allocated_capacity = (size_type)(local_798._M_local_buf + 8);
      local_7a8 = (undefined1  [8])0x0;
      pcStack_7a0 = (char *)0x1;
      local_798._M_local_buf[8] = 0x22;
      local_558 = (_Elt_pointer)0x1;
      local_548 = (_Elt_pointer)0x0;
      views_05._M_len = 3;
      views_05._M_array = (iterator)pcVar34;
      local_560 = (string *)local_838;
      local_550.string_ = (char *)local_798._M_allocated_capacity;
      cmCatViews((string *)&local_8a8,views_05);
      cmSystemTools::Error((string *)&local_8a8);
      if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
           *)local_8a8._M_unused._0_8_ != &local_898) {
        pcVar34 = (char *)((long)&(local_898._M_head_impl)->_M_elems[0]._M_dataplus._M_p + 1);
        operator_delete(local_8a8._M_unused._M_object,(ulong)pcVar34);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_838._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_838 + 0x10)) {
        pcVar34 = (char *)(local_828._M_allocated_capacity + 1);
        operator_delete((void *)local_838._0_8_,(ulong)pcVar34);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_868);
    }
    if (local_7c8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar34 = (char *)&local_7d8;
      (*(code *)local_7c8)((_Any_data *)pcVar34,(_Any_data *)pcVar34,__destroy_functor);
    }
    if (local_7e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar34 = (char *)&local_7f8;
      (*(code *)local_7e8)((_Any_data *)pcVar34,(_Any_data *)pcVar34,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_818._0_8_ != &local_808) {
      pcVar34 = (char *)(local_808._M_allocated_capacity + 1);
      operator_delete((void *)local_818._0_8_,(ulong)pcVar34);
    }
    bVar15 = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2c0);
  Json::Value::~Value((Value *)&local_650);
LAB_00350872:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
              *)local_5c8._M_allocated_capacity,(_Link_type)pcVar34);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
  ::~_Rb_tree(&local_320.Reference._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)&local_320);
LAB_00350899:
  std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::~vector
            ((vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&local_668);
  return bVar15;
}

Assistant:

bool cmGlobalNinjaGenerator::WriteDyndepFile(
  std::string const& dir_top_src, std::string const& dir_top_bld,
  std::string const& dir_cur_src, std::string const& dir_cur_bld,
  std::string const& arg_dd, std::vector<std::string> const& arg_ddis,
  std::string const& module_dir,
  std::vector<std::string> const& linked_target_dirs,
  std::vector<std::string> const& forward_modules_from_target_dirs,
  std::string const& arg_lang, std::string const& arg_modmapfmt,
  cmCxxModuleExportInfo const& export_info)
{
  // Setup path conversions.
  {
    cmStateSnapshot snapshot = this->GetCMakeInstance()->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(dir_cur_src);
    snapshot.GetDirectory().SetCurrentBinary(dir_cur_bld);
    auto mfd = cm::make_unique<cmMakefile>(this, snapshot);
    auto lgd = this->CreateLocalGenerator(mfd.get());
    lgd->SetRelativePathTop(dir_top_src, dir_top_bld);
    this->Makefiles.push_back(std::move(mfd));
    this->LocalGenerators.push_back(std::move(lgd));
  }

  std::vector<cmScanDepInfo> objects;
  for (std::string const& arg_ddi : arg_ddis) {
    cmScanDepInfo info;
    if (!cmScanDepFormat_P1689_Parse(arg_ddi, &info)) {
      cmSystemTools::Error(
        cmStrCat("-E cmake_ninja_dyndep failed to parse ddi file ", arg_ddi));
      return false;
    }
    objects.push_back(std::move(info));
  }

  CxxModuleUsage usages;

  // Map from module name to module file path, if known.
  struct AvailableModuleInfo
  {
    std::string BmiPath;
    bool IsPrivate;
  };
  std::map<std::string, AvailableModuleInfo> mod_files;

  // Populate the module map with those provided by linked targets first.
  for (std::string const& linked_target_dir : linked_target_dirs) {
    std::string const ltmn =
      cmStrCat(linked_target_dir, '/', arg_lang, "Modules.json");
    Json::Value ltm;
    cmsys::ifstream ltmf(ltmn.c_str(), std::ios::in | std::ios::binary);
    if (!ltmf) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to open ",
                                    ltmn, " for module information"));
      return false;
    }
    Json::Reader reader;
    if (!reader.parse(ltmf, ltm, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    linked_target_dir,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
    if (ltm.isObject()) {
      Json::Value const& target_modules = ltm["modules"];
      if (target_modules.isObject()) {
        for (auto i = target_modules.begin(); i != target_modules.end(); ++i) {
          Json::Value const& visible_module = *i;
          if (visible_module.isObject()) {
            Json::Value const& bmi_path = visible_module["bmi"];
            Json::Value const& is_private = visible_module["is-private"];
            mod_files[i.key().asString()] = AvailableModuleInfo{
              bmi_path.asString(),
              is_private.asBool(),
            };
          }
        }
      }
      Json::Value const& target_modules_references = ltm["references"];
      if (target_modules_references.isObject()) {
        for (auto i = target_modules_references.begin();
             i != target_modules_references.end(); ++i) {
          if (i->isObject()) {
            Json::Value const& reference_path = (*i)["path"];
            CxxModuleReference module_reference;
            if (reference_path.isString()) {
              module_reference.Path = reference_path.asString();
            }
            Json::Value const& reference_method = (*i)["lookup-method"];
            if (reference_method.isString()) {
              std::string reference = reference_method.asString();
              if (reference == "by-name") {
                module_reference.Method = LookupMethod::ByName;
              } else if (reference == "include-angle") {
                module_reference.Method = LookupMethod::IncludeAngle;
              } else if (reference == "include-quote") {
                module_reference.Method = LookupMethod::IncludeQuote;
              }
            }
            usages.Reference[i.key().asString()] = module_reference;
          }
        }
      }
      Json::Value const& target_modules_usage = ltm["usages"];
      if (target_modules_usage.isObject()) {
        for (auto i = target_modules_usage.begin();
             i != target_modules_usage.end(); ++i) {
          if (i->isArray()) {
            for (auto j = i->begin(); j != i->end(); ++j) {
              usages.Usage[i.key().asString()].insert(j->asString());
            }
          }
        }
      }
    }
  }

  cm::optional<CxxModuleMapFormat> modmap_fmt;
  if (arg_modmapfmt.empty()) {
    // nothing to do.
  } else if (arg_modmapfmt == "clang") {
    modmap_fmt = CxxModuleMapFormat::Clang;
  } else if (arg_modmapfmt == "gcc") {
    modmap_fmt = CxxModuleMapFormat::Gcc;
  } else if (arg_modmapfmt == "msvc") {
    modmap_fmt = CxxModuleMapFormat::Msvc;
  } else {
    cmSystemTools::Error(
      cmStrCat("-E cmake_ninja_dyndep does not understand the ", arg_modmapfmt,
               " module map format"));
    return false;
  }

  auto module_ext = CxxModuleMapExtension(modmap_fmt);

  // Extend the module map with those provided by this target.
  // We do this after loading the modules provided by linked targets
  // in case we have one of the same name that must be preferred.
  Json::Value target_modules = Json::objectValue;
  for (cmScanDepInfo const& object : objects) {
    for (auto const& p : object.Provides) {
      std::string mod;
      if (cmDyndepCollation::IsBmiOnly(export_info, object.PrimaryOutput)) {
        mod = object.PrimaryOutput;
      } else if (!p.CompiledModulePath.empty()) {
        // The scanner provided the path to the module file.
        mod = p.CompiledModulePath;
        if (!cmSystemTools::FileIsFullPath(mod)) {
          // Treat relative to work directory (top of build tree).
          mod = cmSystemTools::CollapseFullPath(mod, dir_top_bld);
        }
      } else {
        // Assume the module file path matches the logical module name.
        std::string safe_logical_name =
          p.LogicalName; // TODO: needs fixing for header units
        cmSystemTools::ReplaceString(safe_logical_name, ":", "-");
        mod = cmStrCat(module_dir, safe_logical_name, module_ext);
      }
      mod_files[p.LogicalName] = AvailableModuleInfo{
        mod,
        false, // Always visible within our own target.
      };
      Json::Value& module_info = target_modules[p.LogicalName] =
        Json::objectValue;
      module_info["bmi"] = mod;
      module_info["is-private"] =
        cmDyndepCollation::IsObjectPrivate(object.PrimaryOutput, export_info);
    }
  }

  cmGeneratedFileStream ddf(arg_dd);
  ddf << "ninja_dyndep_version = 1.0\n";

  {
    CxxModuleLocations locs;
    locs.RootDirectory = ".";
    locs.PathForGenerator = [this](std::string path) -> std::string {
      path = this->ConvertToNinjaPath(path);
#  ifdef _WIN32
      if (this->IsGCCOnWindows()) {
        std::replace(path.begin(), path.end(), '\\', '/');
      }
#  endif
      return path;
    };
    locs.BmiLocationForModule =
      [&mod_files](std::string const& logical) -> CxxBmiLocation {
      auto m = mod_files.find(logical);
      if (m != mod_files.end()) {
        if (m->second.IsPrivate) {
          return CxxBmiLocation::Private();
        }
        return CxxBmiLocation::Known(m->second.BmiPath);
      }
      return CxxBmiLocation::Unknown();
    };

    // Insert information about the current target's modules.
    if (modmap_fmt) {
      bool private_usage_found = false;
      auto cycle_modules =
        CxxModuleUsageSeed(locs, objects, usages, private_usage_found);
      if (!cycle_modules.empty()) {
        cmSystemTools::Error(
          cmStrCat("Circular dependency detected in the C++ module import "
                   "graph. See modules named: \"",
                   cmJoin(cycle_modules, R"(", ")"_s), '"'));
        return false;
      }
      if (private_usage_found) {
        // Already errored in the function.
        return false;
      }
    }

    cmNinjaBuild build("dyndep");
    build.Outputs.emplace_back("");
    for (cmScanDepInfo const& object : objects) {
      build.Outputs[0] = this->ConvertToNinjaPath(object.PrimaryOutput);
      build.ImplicitOuts.clear();
      for (auto const& p : object.Provides) {
        auto const implicitOut =
          this->ConvertToNinjaPath(mod_files[p.LogicalName].BmiPath);
        // Ignore the `provides` when the BMI is the output.
        if (implicitOut != build.Outputs[0]) {
          build.ImplicitOuts.emplace_back(implicitOut);
        }
      }
      build.ImplicitDeps.clear();
      for (auto const& r : object.Requires) {
        auto mit = mod_files.find(r.LogicalName);
        if (mit != mod_files.end()) {
          build.ImplicitDeps.push_back(
            this->ConvertToNinjaPath(mit->second.BmiPath));
        }
      }
      build.Variables.clear();
      if (!object.Provides.empty()) {
        build.Variables.emplace("restat", "1");
      }

      if (modmap_fmt) {
        auto mm = CxxModuleMapContent(*modmap_fmt, locs, object, usages);

        // XXX(modmap): If changing this path construction, change
        // `cmNinjaTargetGenerator::WriteObjectBuildStatements` and
        // `cmNinjaTargetGenerator::ExportObjectCompileCommand` to generate the
        // corresponding file path.
        cmGeneratedFileStream mmf(cmStrCat(object.PrimaryOutput, ".modmap"));
        mmf.SetCopyIfDifferent(true);
        mmf << mm;
      }

      this->WriteBuild(ddf, build);
    }
  }

  Json::Value target_module_info = Json::objectValue;
  target_module_info["modules"] = target_modules;

  auto& target_usages = target_module_info["usages"] = Json::objectValue;
  for (auto const& u : usages.Usage) {
    auto& mod_usage = target_usages[u.first] = Json::arrayValue;
    for (auto const& v : u.second) {
      mod_usage.append(v);
    }
  }

  auto name_for_method = [](LookupMethod method) -> cm::static_string_view {
    switch (method) {
      case LookupMethod::ByName:
        return "by-name"_s;
      case LookupMethod::IncludeAngle:
        return "include-angle"_s;
      case LookupMethod::IncludeQuote:
        return "include-quote"_s;
    }
    assert(false && "unsupported lookup method");
    return ""_s;
  };

  auto& target_references = target_module_info["references"] =
    Json::objectValue;
  for (auto const& r : usages.Reference) {
    auto& mod_ref = target_references[r.first] = Json::objectValue;
    mod_ref["path"] = r.second.Path;
    mod_ref["lookup-method"] = std::string(name_for_method(r.second.Method));
  }

  // Store the map of modules provided by this target in a file for
  // use by dependents that reference this target in linked-target-dirs.
  std::string const target_mods_file = cmStrCat(
    cmSystemTools::GetFilenamePath(arg_dd), '/', arg_lang, "Modules.json");

  // Populate the module map with those provided by linked targets first.
  for (std::string const& forward_modules_from_target_dir :
       forward_modules_from_target_dirs) {
    std::string const fmftn =
      cmStrCat(forward_modules_from_target_dir, '/', arg_lang, "Modules.json");
    Json::Value fmft;
    cmsys::ifstream fmftf(fmftn.c_str(), std::ios::in | std::ios::binary);
    if (!fmftf) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to open ",
                                    fmftn, " for module information"));
      return false;
    }
    Json::Reader reader;
    if (!reader.parse(fmftf, fmft, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    forward_modules_from_target_dir,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
    if (!fmft.isObject()) {
      continue;
    }

    auto forward_info = [](Json::Value& target, Json::Value const& source) {
      if (!source.isObject()) {
        return;
      }

      for (auto i = source.begin(); i != source.end(); ++i) {
        std::string const key = i.key().asString();
        if (target.isMember(key)) {
          continue;
        }
        target[key] = *i;
      }
    };

    // Forward info from forwarding targets into our collation.
    Json::Value& tmi_target_modules = target_module_info["modules"];
    forward_info(tmi_target_modules, fmft["modules"]);
    forward_info(target_references, fmft["references"]);
    forward_info(target_usages, fmft["usages"]);
  }

  cmGeneratedFileStream tmf(target_mods_file);
  tmf.SetCopyIfDifferent(true);
  tmf << target_module_info;

  cmDyndepMetadataCallbacks cb;
  cb.ModuleFile =
    [mod_files](std::string const& name) -> cm::optional<std::string> {
    auto m = mod_files.find(name);
    if (m != mod_files.end()) {
      return m->second.BmiPath;
    }
    return {};
  };

  return cmDyndepCollation::WriteDyndepMetadata(arg_lang, objects, export_info,
                                                cb);
}